

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::ComputeShaderBase::CheckProgram
          (ComputeShaderBase *this,GLuint program,bool *compile_error)

{
  long lVar1;
  char *format;
  int iVar2;
  CallLogWrapper *this_00;
  bool bVar3;
  allocator_type local_7d;
  GLint length_1;
  GLenum type;
  GLint attached_shaders;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  GLint res;
  GLint status;
  GLint length;
  undefined4 uStack_44;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&status);
  if (status == 0) {
    attached_shaders = 0;
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b85,&attached_shaders);
    if ((long)attached_shaders < 1) {
      bVar3 = true;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&shaders,(long)attached_shaders,(allocator_type *)&length);
      glu::CallLogWrapper::glGetAttachedShaders
                (this_00,program,attached_shaders,(GLsizei *)0x0,
                 shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      iVar2 = 1;
      for (lVar1 = 0; lVar1 < attached_shaders; lVar1 = lVar1 + 1) {
        glu::CallLogWrapper::glGetShaderiv
                  (this_00,shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar1],0x8b4f,(GLint *)&type);
        if (type == 0x8b30) {
          format = "*** Fragment Shader ***\n";
        }
        else {
          format = "*** Vertex Shader ***\n";
          if (type != 0x8b31) {
            if (type == 0x91b9) {
              format = "*** Compute Shader ***\n";
            }
            else {
              format = "*** Unknown Shader ***\n";
            }
          }
        }
        anon_unknown_0::Output(format);
        glu::CallLogWrapper::glGetShaderiv
                  (this_00,shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar1],0x8b81,&res);
        if (res != 1) {
          iVar2 = res;
        }
        length_1 = 0;
        glu::CallLogWrapper::glGetShaderiv
                  (this_00,shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar1],0x8b88,&length_1);
        if (0 < (long)length_1) {
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&length,(long)length_1,&local_7d);
          glu::CallLogWrapper::glGetShaderSource
                    (this_00,shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar1],length_1,
                     (GLsizei *)0x0,(GLchar *)CONCAT44(uStack_44,length));
          anon_unknown_0::Output("%s\n",CONCAT44(uStack_44,length));
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    ((_Vector_base<char,_std::allocator<char>_> *)&length);
        }
        glu::CallLogWrapper::glGetShaderiv
                  (this_00,shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar1],0x8b84,&length_1);
        if (0 < (long)length_1) {
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&length,(long)length_1,&local_7d);
          glu::CallLogWrapper::glGetShaderInfoLog
                    (this_00,shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar1],length_1,
                     (GLsizei *)0x0,(GLchar *)CONCAT44(uStack_44,length));
          anon_unknown_0::Output("%s\n",CONCAT44(uStack_44,length));
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    ((_Vector_base<char,_std::allocator<char>_> *)&length);
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      bVar3 = iVar2 == 1;
    }
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,&length);
    if (0 < (long)length) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&shaders,(long)length,
                 (allocator_type *)&type);
      glu::CallLogWrapper::glGetProgramInfoLog
                (this_00,program,length,(GLsizei *)0x0,
                 (GLchar *)
                 shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      anon_unknown_0::Output
                ("%s\n",shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&shaders);
    }
    if (!bVar3) {
      return false;
    }
  }
  return status == 1;
}

Assistant:

bool CheckProgram(GLuint program, bool* compile_error = NULL)
	{
		GLint compile_status = GL_TRUE;
		GLint status;
		glGetProgramiv(program, GL_LINK_STATUS, &status);

		if (status == GL_FALSE)
		{
			GLint attached_shaders = 0;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						Output("*** Vertex Shader ***\n");
						break;
					case GL_FRAGMENT_SHADER:
						Output("*** Fragment Shader ***\n");
						break;
					case GL_COMPUTE_SHADER:
						Output("*** Compute Shader ***\n");
						break;
					default:
						Output("*** Unknown Shader ***\n");
						break;
					}

					GLint res;
					glGetShaderiv(shaders[i], GL_COMPILE_STATUS, &res);
					if (res != GL_TRUE)
						compile_status = res;

					GLint length = 0;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						Output("%s\n", &source[0]);
					}

					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						Output("%s\n", &log[0]);
					}
				}
			}

			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				Output("%s\n", &log[0]);
			}
		}

		if (compile_error)
			*compile_error = (compile_status == GL_TRUE ? false : true);
		if (compile_status != GL_TRUE)
			return false;
		return status == GL_TRUE ? true : false;
	}